

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O2

int writeEOS(roslz4_stream *str)

{
  void *pvVar1;
  char *pcVar2;
  uint uVar3;
  
  if (str->output_left < 8) {
    return -2;
  }
  pvVar1 = str->state;
  *(undefined4 *)((long)pvVar1 + 0x20) = 1;
  pcVar2 = str->output_next;
  pcVar2[0] = '\0';
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  str->output_next = str->output_next + 4;
  str->output_left = str->output_left + -4;
  str->total_out = str->total_out + 4;
  uVar3 = XXH32_digest(*(void **)((long)pvVar1 + 0x28));
  *(uint *)str->output_next = uVar3;
  str->output_next = str->output_next + 4;
  str->output_left = str->output_left + -4;
  str->total_out = str->total_out + 4;
  *(undefined8 *)((long)pvVar1 + 0x28) = 0;
  return 2;
}

Assistant:

int writeEOS(roslz4_stream *str) {
  if (str->output_left < 8) {
    return ROSLZ4_OUTPUT_SMALL;
  }

  stream_state *state = str->state;
  state->finished = 1;
  writeUInt32((unsigned char*) str->output_next, kEndOfStream);
  advanceOutput(str, 4);

  uint32_t stream_checksum = XXH32_digest(state->xxh32_state);
  writeUInt32((unsigned char*) str->output_next, stream_checksum);
  advanceOutput(str, 4);
  state->xxh32_state = NULL;

  DEBUG("writeEOS() Wrote 8 bytes to output %i\n", str->output_left);
  return ROSLZ4_STREAM_END;
}